

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_sub_abs(mbedtls_mpi *X,mbedtls_mpi *A,mbedtls_mpi *B)

{
  mbedtls_mpi_uint mVar1;
  mbedtls_mpi_uint carry;
  size_t n;
  int ret;
  mbedtls_mpi *B_local;
  mbedtls_mpi *A_local;
  mbedtls_mpi *X_local;
  
  for (carry = (mbedtls_mpi_uint)B->n; (carry != 0 && (B->p[carry - 1] == 0)); carry = carry - 1) {
  }
  if (A->n < carry) {
    n._4_4_ = -10;
  }
  else {
    n._4_4_ = mbedtls_mpi_grow(X,(ulong)A->n);
    if (n._4_4_ == 0) {
      if ((carry < A->n) && (A != X)) {
        memcpy(X->p + carry,A->p + carry,(A->n - carry) * 8);
      }
      if (A->n < X->n) {
        memset(X->p + (int)(uint)A->n,0,(long)(int)((uint)X->n - (uint)A->n) << 3);
      }
      mVar1 = mbedtls_mpi_core_sub(X->p,A->p,B->p,carry);
      if ((mVar1 == 0) ||
         (mVar1 = mbedtls_mpi_core_sub_int(X->p + carry,X->p + carry,mVar1,X->n - carry), mVar1 == 0
         )) {
        X->s = 1;
      }
      else {
        n._4_4_ = -10;
      }
    }
  }
  return n._4_4_;
}

Assistant:

int mbedtls_mpi_sub_abs(mbedtls_mpi *X, const mbedtls_mpi *A, const mbedtls_mpi *B)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t n;
    mbedtls_mpi_uint carry;
    MPI_VALIDATE_RET(X != NULL);
    MPI_VALIDATE_RET(A != NULL);
    MPI_VALIDATE_RET(B != NULL);

    for (n = B->n; n > 0; n--) {
        if (B->p[n - 1] != 0) {
            break;
        }
    }
    if (n > A->n) {
        /* B >= (2^ciL)^n > A */
        ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
        goto cleanup;
    }

    MBEDTLS_MPI_CHK(mbedtls_mpi_grow(X, A->n));

    /* Set the high limbs of X to match A. Don't touch the lower limbs
     * because X might be aliased to B, and we must not overwrite the
     * significant digits of B. */
    if (A->n > n && A != X) {
        memcpy(X->p + n, A->p + n, (A->n - n) * ciL);
    }
    if (X->n > A->n) {
        memset(X->p + A->n, 0, (X->n - A->n) * ciL);
    }

    carry = mbedtls_mpi_core_sub(X->p, A->p, B->p, n);
    if (carry != 0) {
        /* Propagate the carry through the rest of X. */
        carry = mbedtls_mpi_core_sub_int(X->p + n, X->p + n, carry, X->n - n);

        /* If we have further carry/borrow, the result is negative. */
        if (carry != 0) {
            ret = MBEDTLS_ERR_MPI_NEGATIVE_VALUE;
            goto cleanup;
        }
    }

    /* X should always be positive as a result of unsigned subtractions. */
    X->s = 1;

cleanup:
    return ret;
}